

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O2

void __thiscall chrono::ChLinkUniversal::ConstraintsFetch_react(ChLinkUniversal *this,double factor)

{
  ChMatrix33<double> *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ChVector<double> T2;
  ChVector<double> u1;
  ChMatrix33<double> mat2;
  ChVector<double> F2;
  ChVector<double> local_128;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_110;
  ChVector<double> local_108;
  ChMatrix33<double> *local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_c8;
  double dStack_c0;
  double local_b8;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_a8;
  double dStack_a0;
  double local_98;
  ChVector<double> local_58;
  ChVector<double> local_40;
  
  local_40.m_data[0] = factor * (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_40.m_data[1] = factor * (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_40.m_data[2] = factor * (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar2 = factor * (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_a8.m_matrix =
       &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_a8,&local_40);
  pCVar1 = &(this->m_frame2).Amatrix;
  local_c8.m_matrix = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_c8,&local_58);
  if ((ChVector<double> *)&local_a8 != &(this->super_ChLink).react_force) {
    (this->super_ChLink).react_force.m_data[0] = (double)local_a8.m_matrix;
    (this->super_ChLink).react_force.m_data[1] = dStack_a0;
    (this->super_ChLink).react_force.m_data[2] = local_98;
  }
  local_a8.m_matrix =
       (non_const_type)
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dStack_a0 = *(double *)
               ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x18);
  local_98 = *(double *)
              ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array + 0x30);
  ChMatrix33<double>::operator*
            (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix,(ChVector<double> *)&local_a8);
  uStack_e0 = &this->m_v2_tilde;
  local_e8 = &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_a8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_e8);
  local_128.m_data[2] = dVar2 * local_b8;
  local_128.m_data[0] = dVar2 * (double)local_c8.m_matrix;
  local_128.m_data[1] = dVar2 * dStack_c0;
  local_108.m_data[0] = (double)&local_a8;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_108,&local_128);
  auVar3._0_8_ = local_d8 ^ 0x8000000000000000;
  auVar3._8_4_ = 0;
  auVar3._12_4_ = 0x80000000;
  local_108.m_data[1]._4_4_ = uStack_e0._4_4_ ^ 0x80000000;
  local_108.m_data[0] = -(double)local_e8;
  local_108.m_data[1]._0_4_ = (undefined4)uStack_e0;
  local_108.m_data[2] = (double)vmovlps_avx(auVar3);
  local_110.m_matrix = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_110,&local_108);
  if (&local_128 != &(this->super_ChLink).react_torque) {
    (this->super_ChLink).react_torque.m_data[0] = local_128.m_data[0];
    (this->super_ChLink).react_torque.m_data[1] = local_128.m_data[1];
    (this->super_ChLink).react_torque.m_data[2] = local_128.m_data[2];
  }
  return;
}

Assistant:

void ChLinkUniversal::ConstraintsFetch_react(double factor) {
    // Extract the Lagrange multipliers for the 3 spherical constraints and for
    // the dot constraint.
    ChVector<> lam_sph(m_cnstr_x.Get_l_i(), m_cnstr_y.Get_l_i(), m_cnstr_z.Get_l_i());
    double lam_dot = m_cnstr_dot.Get_l_i();

    // Note that the Lagrange multipliers must be multiplied by 'factor' to
    // convert from reaction impulses to reaction forces.
    lam_sph *= factor;
    lam_dot *= factor;

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the universal joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(v2') *A_2^T * u1 * lam_dot
    //     = -C^T * [A_2 * tilde(v2')]^T * u1 * lam_dot

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_v2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_dot * u1);
    react_torque = m_frame2.GetA().transpose() * (-T2);
}